

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O2

char * Gia_ManFormulaEndToken(char *pForm)

{
  char cVar1;
  int iVar2;
  
  iVar2 = 0;
  do {
    cVar1 = *pForm;
    if (cVar1 == '(') {
      iVar2 = iVar2 + 1;
    }
    else if (cVar1 == ')') {
      iVar2 = iVar2 + -1;
    }
    else {
      if (cVar1 == '\0') {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                      ,0x280,"char *Gia_ManFormulaEndToken(char *)");
      }
      if (cVar1 == '~') {
        __assert_fail("*pThis != \'~\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                      ,0x278,"char *Gia_ManFormulaEndToken(char *)");
      }
    }
    pForm = pForm + 1;
    if (iVar2 == 0) {
      return pForm;
    }
  } while( true );
}

Assistant:

char * Gia_ManFormulaEndToken( char * pForm )
{
    int Counter = 0;
    char * pThis;
    for ( pThis = pForm; *pThis; pThis++ )
    {
        assert( *pThis != '~' );
        if ( *pThis == '(' )
            Counter++;
        else if ( *pThis == ')' )
            Counter--;
        if ( Counter == 0 )
            return pThis + 1;
    }
    assert( 0 );
    return NULL;
}